

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O1

void __thiscall cmCTestCVS::LogParser::FinishRevision(LogParser *this)

{
  ostream *poVar1;
  undefined1 local_130 [32];
  _Alloc_hider local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if ((this->Rev).Rev._M_string_length != 0) {
    poVar1 = (this->CVS->super_cmCTestVC).Log;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Found revision ",0xf);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(this->Rev).Rev._M_dataplus._M_p,(this->Rev).Rev._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  author = ",0xb);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(this->Rev).Author._M_dataplus._M_p,
                        (this->Rev).Author._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  date = ",9);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(this->Rev).Date._M_dataplus._M_p,(this->Rev).Date._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::push_back
              (this->Revisions,&this->Rev);
    if (0x100 < (ulong)((long)(this->Revisions->
                              super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->Revisions->
                             super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>
                             )._M_impl.super__Vector_impl_data._M_start)) {
      this->Section = SectionEnd;
    }
  }
  memset((Revision *)local_130,0,0x100);
  local_130._0_8_ = local_130 + 0x10;
  local_130._8_8_ = 0;
  local_130[0x10] = '\0';
  local_110._M_p = (pointer)&local_100;
  local_108 = 0;
  local_100._M_local_buf[0] = '\0';
  local_f0._M_p = (pointer)&local_e0;
  local_e8 = 0;
  local_e0._M_local_buf[0] = '\0';
  local_d0._M_p = (pointer)&local_c0;
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  local_b0._M_p = (pointer)&local_a0;
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  local_90._M_p = (pointer)&local_80;
  local_88 = 0;
  local_80._M_local_buf[0] = '\0';
  local_70._M_p = (pointer)&local_60;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  std::__cxx11::string::operator=((string *)&this->Rev,(string *)local_130);
  std::__cxx11::string::operator=((string *)&(this->Rev).Date,(string *)&local_110);
  std::__cxx11::string::operator=((string *)&(this->Rev).Author,(string *)&local_f0);
  std::__cxx11::string::operator=((string *)&(this->Rev).EMail,(string *)&local_d0);
  std::__cxx11::string::operator=((string *)&(this->Rev).Committer,(string *)&local_b0);
  std::__cxx11::string::operator=((string *)&(this->Rev).CommitterEMail,(string *)&local_90);
  std::__cxx11::string::operator=((string *)&(this->Rev).CommitDate,(string *)&local_70);
  std::__cxx11::string::operator=((string *)&(this->Rev).Log,(string *)&local_50);
  cmCTestVC::Revision::~Revision((Revision *)local_130);
  return;
}

Assistant:

void FinishRevision()
  {
    if (!this->Rev.Rev.empty()) {
      // Record this revision.
      /* clang-format off */
      this->CVS->Log << "Found revision " << this->Rev.Rev << "\n"
                     << "  author = " << this->Rev.Author << "\n"
                     << "  date = " << this->Rev.Date << "\n";
      /* clang-format on */
      this->Revisions.push_back(this->Rev);

      // We only need two revisions.
      if (this->Revisions.size() >= 2) {
        this->Section = SectionEnd;
      }
    }
    this->Rev = Revision();
  }